

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbdrmscreen.cpp
# Opt level: O3

void __thiscall QLinuxFbDevice::QLinuxFbDevice(QLinuxFbDevice *this,QKmsScreenConfig *screenConfig)

{
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.d = (Data *)0x0;
  local_30.d.ptr = L"/dev/dri/card0";
  local_30.d.size = 0xe;
  QKmsDevice::QKmsDevice(&this->super_QKmsDevice,screenConfig,&local_30);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->super_QKmsDevice)._vptr_QKmsDevice = (_func_int **)&PTR__QLinuxFbDevice_00154d80;
  (this->m_outputs).d.d = (Data *)0x0;
  (this->m_outputs).d.ptr = (Output *)0x0;
  (this->m_outputs).d.size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLinuxFbDevice::QLinuxFbDevice(QKmsScreenConfig *screenConfig)
    : QKmsDevice(screenConfig, QStringLiteral("/dev/dri/card0"))
{
}